

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_test_tests.cpp
# Opt level: O1

void __thiscall
test::iu_TypedTest3_x_iutest_x_Mul2_Test<float>::Body
          (iu_TypedTest3_x_iutest_x_Mul2_Test<float> *this)

{
  return;
}

Assistant:

IUTEST_TYPED_TEST(TypedTest3, Mul2)
{
    TypeParam x = 1;
    IUTEST_ASSERT_LT(x, 2*x);
}